

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wcssub.c
# Opt level: O0

int ffgics(fitsfile *fptr,double *xrval,double *yrval,double *xrpix,double *yrpix,double *xinc,
          double *yinc,double *rot,char *type,int *status)

{
  undefined8 uVar1;
  int iVar2;
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  undefined8 *in_R8;
  double *in_R9;
  int *piVar3;
  double dVar4;
  double *in_stack_00000008;
  double *in_stack_00000010;
  char *in_stack_00000018;
  int *in_stack_00000020;
  double toler;
  double temp;
  double phib;
  double phia;
  double pi;
  double pc12;
  double pc22;
  double pc21;
  double pc11;
  double cd12;
  double cd22;
  double cd21;
  double cd11;
  char ctype [71];
  int pc_exists;
  int cd_exists;
  int tstat;
  int *local_130;
  int *local_128;
  int *local_110;
  int *local_108;
  int *in_stack_ffffffffffffff08;
  int *in_stack_ffffffffffffff10;
  double *in_stack_ffffffffffffff18;
  char *keyname;
  fitsfile *fptr_00;
  char local_98;
  char acStack_97 [3];
  char acStack_94 [80];
  int local_44;
  int local_40;
  undefined4 local_3c;
  double *local_38;
  undefined8 *local_30;
  undefined8 *local_28;
  undefined8 *local_20;
  undefined8 *local_18;
  int local_4;
  
  local_40 = 0;
  local_44 = 0;
  fptr_00 = (fitsfile *)0x0;
  keyname = (char *)0x400921fb54442d18;
  if (*in_stack_00000020 < 1) {
    local_3c = 0;
    local_38 = in_R9;
    local_30 = in_R8;
    local_28 = in_RCX;
    local_20 = in_RDX;
    local_18 = in_RSI;
    iVar2 = ffgkyd((fitsfile *)0x0,(char *)0x400921fb54442d18,in_stack_ffffffffffffff18,
                   (char *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    if (iVar2 != 0) {
      *local_18 = 0;
    }
    local_3c = 0;
    iVar2 = ffgkyd(fptr_00,keyname,in_stack_ffffffffffffff18,(char *)in_stack_ffffffffffffff10,
                   in_stack_ffffffffffffff08);
    if (iVar2 != 0) {
      *local_20 = 0;
    }
    local_3c = 0;
    iVar2 = ffgkyd(fptr_00,keyname,in_stack_ffffffffffffff18,(char *)in_stack_ffffffffffffff10,
                   in_stack_ffffffffffffff08);
    if (iVar2 != 0) {
      *local_28 = 0;
    }
    local_3c = 0;
    iVar2 = ffgkyd(fptr_00,keyname,in_stack_ffffffffffffff18,(char *)in_stack_ffffffffffffff10,
                   in_stack_ffffffffffffff08);
    if (iVar2 != 0) {
      *local_30 = 0;
    }
    local_3c = 0;
    iVar2 = ffgkyd(fptr_00,keyname,in_stack_ffffffffffffff18,(char *)in_stack_ffffffffffffff10,
                   in_stack_ffffffffffffff08);
    if (iVar2 == 0) {
      iVar2 = ffgkyd(fptr_00,keyname,in_stack_ffffffffffffff18,(char *)in_stack_ffffffffffffff10,
                     in_stack_ffffffffffffff08);
      if (iVar2 != 0) {
        *in_stack_00000008 = 1.0;
      }
      local_3c = 0;
      iVar2 = ffgkyd(fptr_00,keyname,in_stack_ffffffffffffff18,(char *)in_stack_ffffffffffffff10,
                     in_stack_ffffffffffffff08);
      if (iVar2 != 0) {
        *in_stack_00000010 = 0.0;
        local_3c = 0;
        iVar2 = ffgkyd(fptr_00,keyname,in_stack_ffffffffffffff18,(char *)in_stack_ffffffffffffff10,
                       in_stack_ffffffffffffff08);
        if (iVar2 == 0) {
          local_44 = 1;
        }
        else {
          local_3c = 0;
        }
        iVar2 = ffgkyd(fptr_00,keyname,in_stack_ffffffffffffff18,(char *)in_stack_ffffffffffffff10,
                       in_stack_ffffffffffffff08);
        if (iVar2 == 0) {
          local_44 = 1;
        }
        else {
          local_3c = 0;
        }
        iVar2 = ffgkyd(fptr_00,keyname,in_stack_ffffffffffffff18,(char *)in_stack_ffffffffffffff10,
                       in_stack_ffffffffffffff08);
        if (iVar2 == 0) {
          local_44 = 1;
        }
        else {
          local_3c = 0;
        }
        iVar2 = ffgkyd(fptr_00,keyname,in_stack_ffffffffffffff18,(char *)in_stack_ffffffffffffff10,
                       in_stack_ffffffffffffff08);
        if (iVar2 == 0) {
          local_44 = 1;
        }
        else {
          local_3c = 0;
        }
        if (local_44 != 0) {
          piVar3 = (int *)atan2(0.0,1.0);
          local_130 = (int *)atan2(-(double)fptr_00,1.0);
          local_128 = local_130;
          if ((double)piVar3 < (double)local_130) {
            local_128 = piVar3;
          }
          if ((double)local_130 < (double)piVar3) {
            local_130 = piVar3;
          }
          piVar3 = local_128;
          if ((double)keyname / 2.0 < (double)local_130 - (double)local_128) {
            piVar3 = (int *)((double)keyname + (double)local_128);
          }
          if (0.0002 < ABS((double)piVar3 - (double)local_130)) {
            *in_stack_00000020 = 0x1fa;
          }
          in_stack_ffffffffffffff18 = (double *)(((double)piVar3 + (double)local_130) / 2.0);
          *in_stack_00000010 = ((double)in_stack_ffffffffffffff18 * 180.0) / (double)keyname;
          in_stack_ffffffffffffff08 = local_128;
          in_stack_ffffffffffffff10 = local_130;
        }
      }
    }
    else {
      local_3c = 0;
      iVar2 = ffgkyd(fptr_00,keyname,in_stack_ffffffffffffff18,(char *)in_stack_ffffffffffffff10,
                     in_stack_ffffffffffffff08);
      if (iVar2 == 0) {
        local_40 = 1;
      }
      else {
        local_3c = 0;
      }
      iVar2 = ffgkyd(fptr_00,keyname,in_stack_ffffffffffffff18,(char *)in_stack_ffffffffffffff10,
                     in_stack_ffffffffffffff08);
      if (iVar2 == 0) {
        local_40 = 1;
      }
      else {
        local_3c = 0;
      }
      iVar2 = ffgkyd(fptr_00,keyname,in_stack_ffffffffffffff18,(char *)in_stack_ffffffffffffff10,
                     in_stack_ffffffffffffff08);
      if (iVar2 == 0) {
        local_40 = 1;
      }
      else {
        local_3c = 0;
      }
      iVar2 = ffgkyd(fptr_00,keyname,in_stack_ffffffffffffff18,(char *)in_stack_ffffffffffffff10,
                     in_stack_ffffffffffffff08);
      if (iVar2 == 0) {
        local_40 = 1;
      }
      else {
        local_3c = 0;
      }
      if (local_40 == 0) {
        *local_38 = 1.0;
        local_3c = 0;
        iVar2 = ffgkyd(fptr_00,keyname,in_stack_ffffffffffffff18,(char *)in_stack_ffffffffffffff10,
                       in_stack_ffffffffffffff08);
        if (iVar2 != 0) {
          *in_stack_00000008 = 1.0;
        }
        local_3c = 0;
        iVar2 = ffgkyd(fptr_00,keyname,in_stack_ffffffffffffff18,(char *)in_stack_ffffffffffffff10,
                       in_stack_ffffffffffffff08);
        if (iVar2 != 0) {
          *in_stack_00000010 = 0.0;
        }
      }
      else {
        piVar3 = (int *)atan2(0.0,0.0);
        local_110 = (int *)atan2(-0.0,0.0);
        local_108 = local_110;
        if ((double)piVar3 < (double)local_110) {
          local_108 = piVar3;
        }
        if ((double)local_110 < (double)piVar3) {
          local_110 = piVar3;
        }
        piVar3 = local_108;
        if ((double)keyname / 2.0 < (double)local_110 - (double)local_108) {
          piVar3 = (int *)((double)keyname + (double)local_108);
        }
        if (0.0002 < ABS((double)piVar3 - (double)local_110)) {
          *in_stack_00000020 = 0x1fa;
        }
        in_stack_ffffffffffffff18 = (double *)(((double)piVar3 + (double)local_110) / 2.0);
        dVar4 = cos((double)in_stack_ffffffffffffff18);
        *local_38 = 0.0 / dVar4;
        dVar4 = cos((double)in_stack_ffffffffffffff18);
        *in_stack_00000008 = 0.0 / dVar4;
        *in_stack_00000010 = ((double)in_stack_ffffffffffffff18 * 180.0) / (double)keyname;
        in_stack_ffffffffffffff08 = local_108;
        in_stack_ffffffffffffff10 = local_110;
        if (*in_stack_00000008 <= 0.0 && *in_stack_00000008 != 0.0) {
          *local_38 = -*local_38;
          *in_stack_00000008 = -*in_stack_00000008;
          *in_stack_00000010 = *in_stack_00000010 - 180.0;
        }
      }
    }
    local_3c = 0;
    iVar2 = ffgkys(fptr_00,keyname,(char *)in_stack_ffffffffffffff18,
                   (char *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    if (iVar2 == 0) {
      strncpy(in_stack_00000018,acStack_94,4);
      in_stack_00000018[4] = '\0';
      iVar2 = strncmp(&local_98,"DEC-",4);
      if ((iVar2 == 0) || (iVar2 = strncmp(acStack_97,"LAT",3), iVar2 == 0)) {
        *in_stack_00000010 = 90.0 - *in_stack_00000010;
        *in_stack_00000008 = -*in_stack_00000008;
        uVar1 = *local_18;
        *local_18 = *local_20;
        *local_20 = uVar1;
      }
    }
    else {
      *in_stack_00000018 = '\0';
    }
    local_4 = *in_stack_00000020;
  }
  else {
    local_4 = *in_stack_00000020;
  }
  return local_4;
}

Assistant:

int ffgics(fitsfile *fptr,    /* I - FITS file pointer           */
           double *xrval,     /* O - X reference value           */
           double *yrval,     /* O - Y reference value           */
           double *xrpix,     /* O - X reference pixel           */
           double *yrpix,     /* O - Y reference pixel           */
           double *xinc,      /* O - X increment per pixel       */
           double *yinc,      /* O - Y increment per pixel       */
           double *rot,       /* O - rotation angle (degrees)    */
           char *type,        /* O - type of projection ('-tan') */
           int *status)       /* IO - error status               */
/*
       read the values of the celestial coordinate system keywords.
       These values may be used as input to the subroutines that
       calculate celestial coordinates. (ffxypx, ffwldp)

       Modified in Nov 1999 to convert the CD matrix keywords back
       to the old CDELTn form, and to swap the axes if the dec-like
       axis is given first, and to assume default values if any of the
       keywords are not present.
*/
{
    int tstat = 0, cd_exists = 0, pc_exists = 0;
    char ctype[FLEN_VALUE];
    double cd11 = 0.0, cd21 = 0.0, cd22 = 0.0, cd12 = 0.0;
    double pc11 = 1.0, pc21 = 0.0, pc22 = 1.0, pc12 = 0.0;
    double pi =  3.1415926535897932;
    double phia, phib, temp;
    double toler = .0002;  /* tolerance for angles to agree (radians) */
                           /*   (= approximately 0.01 degrees) */

    if (*status > 0)
       return(*status);

    tstat = 0;
    if (ffgkyd(fptr, "CRVAL1", xrval, NULL, &tstat))
       *xrval = 0.;

    tstat = 0;
    if (ffgkyd(fptr, "CRVAL2", yrval, NULL, &tstat))
       *yrval = 0.;

    tstat = 0;
    if (ffgkyd(fptr, "CRPIX1", xrpix, NULL, &tstat))
        *xrpix = 0.;

    tstat = 0;
    if (ffgkyd(fptr, "CRPIX2", yrpix, NULL, &tstat))
        *yrpix = 0.;

    /* look for CDELTn first, then CDi_j keywords */
    tstat = 0;
    if (ffgkyd(fptr, "CDELT1", xinc, NULL, &tstat))
    {
        /* CASE 1: no CDELTn keyword, so look for the CD matrix */
        tstat = 0;
        if (ffgkyd(fptr, "CD1_1", &cd11, NULL, &tstat))
            tstat = 0;  /* reset keyword not found error */
        else
            cd_exists = 1;  /* found at least 1 CD_ keyword */

        if (ffgkyd(fptr, "CD2_1", &cd21, NULL, &tstat))
            tstat = 0;  /* reset keyword not found error */
        else
            cd_exists = 1;  /* found at least 1 CD_ keyword */

        if (ffgkyd(fptr, "CD1_2", &cd12, NULL, &tstat))
            tstat = 0;  /* reset keyword not found error */
        else
            cd_exists = 1;  /* found at least 1 CD_ keyword */

        if (ffgkyd(fptr, "CD2_2", &cd22, NULL, &tstat))
            tstat = 0;  /* reset keyword not found error */
        else
            cd_exists = 1;  /* found at least 1 CD_ keyword */

        if (cd_exists)  /* convert CDi_j back to CDELTn */
        {
            /* there are 2 ways to compute the angle: */
            phia = atan2( cd21, cd11);
            phib = atan2(-cd12, cd22);

            /* ensure that phia <= phib */
            temp = minvalue(phia, phib);
            phib = maxvalue(phia, phib);
            phia = temp;

            /* there is a possible 180 degree ambiguity in the angles */
            /* so add 180 degress to the smaller value if the values  */
            /* differ by more than 90 degrees = pi/2 radians.         */
            /* (Later, we may decide to take the other solution by    */
            /* subtracting 180 degrees from the larger value).        */

            if ((phib - phia) > (pi / 2.))
               phia += pi;

            if (fabs(phia - phib) > toler) 
            {
               /* angles don't agree, so looks like there is some skewness */
               /* between the axes.  Return with an error to be safe. */
               *status = APPROX_WCS_KEY;
            }
      
            phia = (phia + phib) /2.;  /* use the average of the 2 values */
            *xinc = cd11 / cos(phia);
            *yinc = cd22 / cos(phia);
            *rot = phia * 180. / pi;

            /* common usage is to have a positive yinc value.  If it is */
            /* negative, then subtract 180 degrees from rot and negate  */
            /* both xinc and yinc.  */

            if (*yinc < 0)
            {
                *xinc = -(*xinc);
                *yinc = -(*yinc);
                *rot = *rot - 180.;
            }
        }
        else   /* no CD matrix keywords either */
        {
            *xinc = 1.;

            /* there was no CDELT1 keyword, but check for CDELT2 just in case */
            tstat = 0;
            if (ffgkyd(fptr, "CDELT2", yinc, NULL, &tstat))
                *yinc = 1.;

            tstat = 0;
            if (ffgkyd(fptr, "CROTA2", rot, NULL, &tstat))
                *rot=0.;
        }
    }
    else  /* Case 2: CDELTn + optional PC matrix */
    {
        if (ffgkyd(fptr, "CDELT2", yinc, NULL, &tstat))
            *yinc = 1.;

        tstat = 0;
        if (ffgkyd(fptr, "CROTA2", rot, NULL, &tstat))
        {
            *rot=0.;

            /* no CROTA2 keyword, so look for the PC matrix */
            tstat = 0;
            if (ffgkyd(fptr, "PC1_1", &pc11, NULL, &tstat))
                tstat = 0;  /* reset keyword not found error */
            else
                pc_exists = 1;  /* found at least 1 PC_ keyword */

            if (ffgkyd(fptr, "PC2_1", &pc21, NULL, &tstat))
                tstat = 0;  /* reset keyword not found error */
            else
                pc_exists = 1;  /* found at least 1 PC_ keyword */

            if (ffgkyd(fptr, "PC1_2", &pc12, NULL, &tstat))
                tstat = 0;  /* reset keyword not found error */
            else
                pc_exists = 1;  /* found at least 1 PC_ keyword */

            if (ffgkyd(fptr, "PC2_2", &pc22, NULL, &tstat))
                tstat = 0;  /* reset keyword not found error */
            else
                pc_exists = 1;  /* found at least 1 PC_ keyword */

            if (pc_exists)  /* convert PCi_j back to CDELTn */
            {
                /* there are 2 ways to compute the angle: */
                phia = atan2( pc21, pc11);
                phib = atan2(-pc12, pc22);

                /* ensure that phia <= phib */
                temp = minvalue(phia, phib);
                phib = maxvalue(phia, phib);
                phia = temp;

                /* there is a possible 180 degree ambiguity in the angles */
                /* so add 180 degress to the smaller value if the values  */
                /* differ by more than 90 degrees = pi/2 radians.         */
                /* (Later, we may decide to take the other solution by    */
                /* subtracting 180 degrees from the larger value).        */

                if ((phib - phia) > (pi / 2.))
                   phia += pi;

                if (fabs(phia - phib) > toler) 
                {
                  /* angles don't agree, so looks like there is some skewness */
                  /* between the axes.  Return with an error to be safe. */
                  *status = APPROX_WCS_KEY;
                }
      
                phia = (phia + phib) /2.;  /* use the average of the 2 values */
                *rot = phia * 180. / pi;
            }
        }
    }

    /* get the type of projection, if any */
    tstat = 0;
    if (ffgkys(fptr, "CTYPE1", ctype, NULL, &tstat))
         type[0] = '\0';
    else
    {
        /* copy the projection type string */
        strncpy(type, &ctype[4], 4);
        type[4] = '\0';

        /* check if RA and DEC are inverted */
        if (!strncmp(ctype, "DEC-", 4) || !strncmp(ctype+1, "LAT", 3))
        {
            /* the latitudinal axis is given first, so swap them */

/*
 this case was removed on 12/9.  Apparently not correct.

            if ((*xinc / *yinc) < 0. )  
                *rot = -90. - (*rot);
            else
*/
            *rot = 90. - (*rot);

            /* Empirical tests with ds9 show the y-axis sign must be negated */
            /* and the xinc and yinc values must NOT be swapped. */
            *yinc = -(*yinc);

            temp = *xrval;
            *xrval = *yrval;
            *yrval = temp;
        }   
    }

    return(*status);
}